

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t union_vector16(uint16_t *array1,uint32_t length1,uint16_t *array2,uint32_t length2,
                       uint16_t *output)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  size_t sVar7;
  __m128i *palVar8;
  __m128i *palVar9;
  longlong extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong lVar10;
  uint16_t *output_00;
  __m128i old;
  __m128i old_00;
  __m128i old_01;
  __m128i old_02;
  __m128i newval;
  __m128i newval_00;
  __m128i newval_01;
  __m128i newval_02;
  uint16_t local_128 [2];
  uint32_t leftoversize;
  uint16_t buffer [16];
  uint32_t len;
  uint16_t curB;
  uint16_t curA;
  uint32_t pos2;
  uint32_t pos1;
  uint32_t len2;
  uint32_t len1;
  uint16_t *initoutput;
  __m128i laststore;
  __m128i vecMax;
  __m128i vecMin;
  __m128i V;
  __m128i vB;
  __m128i vA;
  uint16_t *local_80;
  uint16_t *output_local;
  uint32_t length2_local;
  uint16_t *array2_local;
  uint32_t length1_local;
  uint16_t *array1_local;
  longlong lStack_20;
  longlong extraout_RDX_00;
  longlong extraout_RDX_03;
  
  if ((length1 < 8) || (length2 < 8)) {
    sVar7 = union_uint16(array1,(ulong)length1,array2,(ulong)length2,output);
    return (uint32_t)sVar7;
  }
  uVar2 = length1 >> 3;
  uVar3 = length2 >> 3;
  unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])array1);
  _curB = 1;
  unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])array2);
  len = 1;
  palVar9 = (__m128i *)(V + 1);
  palVar8 = (__m128i *)(laststore + 1);
  output_00 = output;
  sse_merge((__m128i *)(vB + 1),palVar9,(__m128i *)(vecMax + 1),palVar8);
  auVar1 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,0xffff,7);
  lStack_20 = auVar1._8_8_;
  laststore[0] = lStack_20;
  old[1] = (longlong)palVar9;
  old[0] = (longlong)output;
  newval[1] = (longlong)palVar8;
  newval[0] = extraout_RDX;
  iVar4 = store_unique(old,newval,output_00);
  local_80 = output + iVar4;
  laststore[0] = vecMin[0];
  lVar10 = extraout_RDX_00;
  uVar6 = 1;
  uVar5 = 1;
  if ((1 < uVar2) && (uVar6 = len, uVar5 = _curB, 1 < uVar3)) {
    buffer[0xf] = array1[8];
    buffer[0xe] = array2[8];
    len = 1;
    _curB = 1;
    do {
      if (buffer[0xe] < buffer[0xf]) {
        unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(array2 + (ulong)len * 8));
        len = len + 1;
        if (uVar3 <= len) goto LAB_0010432f;
        buffer[0xe] = array2[len * 8];
      }
      else {
        unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(array1 + (ulong)_curB * 8));
        _curB = _curB + 1;
        if (uVar2 <= _curB) goto LAB_0010432f;
        buffer[0xf] = array1[_curB * 8];
      }
      palVar9 = (__m128i *)(laststore + 1);
      palVar8 = palVar9;
      sse_merge((__m128i *)(vecMin + 1),palVar9,(__m128i *)(vecMax + 1),palVar9);
      old_00[1] = (longlong)palVar8;
      old_00[0] = (longlong)local_80;
      newval_00[1] = (longlong)palVar9;
      newval_00[0] = extraout_RDX_01;
      iVar4 = store_unique(old_00,newval_00,output_00);
      local_80 = local_80 + iVar4;
    } while( true );
  }
LAB_00104388:
  _curB = uVar5;
  len = uVar6;
  buffer._24_4_ = (undefined4)((long)local_80 - (long)output >> 1);
  old_02[1] = (longlong)palVar9;
  old_02[0] = (longlong)local_128;
  newval_02[1] = (longlong)output;
  newval_02[0] = lVar10;
  uVar5 = store_unique(old_02,newval_02,output_00);
  if (_curB == uVar2) {
    memcpy(local_128 + uVar5,array1 + (_curB << 3),(ulong)(length1 + uVar2 * -8) << 1);
    uVar5 = length1 + uVar2 * -8 + uVar5;
    qsort(local_128,(ulong)uVar5,2,uint16_compare);
    uVar6 = unique(local_128,uVar5);
    sVar7 = union_uint16(local_128,(ulong)uVar6,array2 + (len << 3),(ulong)(length2 + len * -8),
                         local_80);
    buffer._24_4_ = (int)sVar7 + buffer._24_4_;
  }
  else {
    memcpy(local_128 + uVar5,array2 + (len << 3),(ulong)(length2 + uVar3 * -8) << 1);
    uVar5 = length2 + uVar3 * -8 + uVar5;
    qsort(local_128,(ulong)uVar5,2,uint16_compare);
    uVar6 = unique(local_128,uVar5);
    sVar7 = union_uint16(local_128,(ulong)uVar6,array1 + (_curB << 3),(ulong)(length1 + _curB * -8),
                         local_80);
    buffer._24_4_ = (int)sVar7 + buffer._24_4_;
  }
  uVar6._0_2_ = buffer[0xc];
  uVar6._2_2_ = buffer[0xd];
  return uVar6;
LAB_0010432f:
  palVar8 = (__m128i *)(laststore + 1);
  palVar9 = palVar8;
  sse_merge((__m128i *)(vecMin + 1),palVar8,(__m128i *)(vecMax + 1),palVar8);
  old_01[1] = (longlong)palVar9;
  old_01[0] = (longlong)local_80;
  newval_01[1] = (longlong)palVar8;
  newval_01[0] = extraout_RDX_02;
  iVar4 = store_unique(old_01,newval_01,output_00);
  local_80 = local_80 + iVar4;
  laststore[0] = vecMin[0];
  lVar10 = extraout_RDX_03;
  uVar6 = len;
  uVar5 = _curB;
  goto LAB_00104388;
}

Assistant:

CROARING_TARGET_AVX2
// a one-pass SSE union algorithm
// This function may not be safe if array1 == output or array2 == output.
uint32_t union_vector16(const uint16_t *__restrict__ array1, uint32_t length1,
                        const uint16_t *__restrict__ array2, uint32_t length2,
                        uint16_t *__restrict__ output) {
    if ((length1 < 8) || (length2 < 8)) {
        return (uint32_t)union_uint16(array1, length1, array2, length2, output);
    }
    __m128i vA, vB, V, vecMin, vecMax;
    __m128i laststore;
    uint16_t *initoutput = output;
    uint32_t len1 = length1 / 8;
    uint32_t len2 = length2 / 8;
    uint32_t pos1 = 0;
    uint32_t pos2 = 0;
    // we start the machine
    vA = _mm_lddqu_si128((const __m128i *)array1 + pos1);
    pos1++;
    vB = _mm_lddqu_si128((const __m128i *)array2 + pos2);
    pos2++;
    sse_merge(&vA, &vB, &vecMin, &vecMax);
    laststore = _mm_set1_epi16(-1);
    output += store_unique(laststore, vecMin, output);
    laststore = vecMin;
    if ((pos1 < len1) && (pos2 < len2)) {
        uint16_t curA, curB;
        curA = array1[8 * pos1];
        curB = array2[8 * pos2];
        while (true) {
            if (curA <= curB) {
                V = _mm_lddqu_si128((const __m128i *)array1 + pos1);
                pos1++;
                if (pos1 < len1) {
                    curA = array1[8 * pos1];
                } else {
                    break;
                }
            } else {
                V = _mm_lddqu_si128((const __m128i *)array2 + pos2);
                pos2++;
                if (pos2 < len2) {
                    curB = array2[8 * pos2];
                } else {
                    break;
                }
            }
            sse_merge(&V, &vecMax, &vecMin, &vecMax);
            output += store_unique(laststore, vecMin, output);
            laststore = vecMin;
        }
        sse_merge(&V, &vecMax, &vecMin, &vecMax);
        output += store_unique(laststore, vecMin, output);
        laststore = vecMin;
    }
    // we finish the rest off using a scalar algorithm
    // could be improved?
    //
    // copy the small end on a tmp buffer
    uint32_t len = (uint32_t)(output - initoutput);
    uint16_t buffer[16];
    uint32_t leftoversize = store_unique(laststore, vecMax, buffer);
    if (pos1 == len1) {
        memcpy(buffer + leftoversize, array1 + 8 * pos1,
               (length1 - 8 * len1) * sizeof(uint16_t));
        leftoversize += length1 - 8 * len1;
        qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);

        leftoversize = unique(buffer, leftoversize);
        len += (uint32_t)union_uint16(buffer, leftoversize, array2 + 8 * pos2,
                                      length2 - 8 * pos2, output);
    } else {
        memcpy(buffer + leftoversize, array2 + 8 * pos2,
               (length2 - 8 * len2) * sizeof(uint16_t));
        leftoversize += length2 - 8 * len2;
        qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
        leftoversize = unique(buffer, leftoversize);
        len += (uint32_t)union_uint16(buffer, leftoversize, array1 + 8 * pos1,
                                      length1 - 8 * pos1, output);
    }
    return len;
}